

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

bool __thiscall
perfetto::protos::gen::TraceStats_BufferStats::ParseFromArray
          (TraceStats_BufferStats *this,void *raw,size_t size)

{
  byte bVar1;
  uint uVar2;
  undefined1 uVar3;
  uint uVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  uint *puVar8;
  uint *puVar9;
  bool bVar10;
  uint *puVar11;
  ulong uVar12;
  uint *puVar13;
  uint *puVar14;
  uint *puVar15;
  uint uVar16;
  uint *in_R11;
  uint *puVar17;
  uint *puVar18;
  TraceStats_BufferStats *pTVar19;
  bool bVar20;
  Field local_60;
  uint *local_50;
  TraceStats_BufferStats *local_48;
  uint *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  local_38 = &this->unknown_fields_;
  (this->unknown_fields_)._M_string_length = 0;
  *(this->unknown_fields_)._M_dataplus._M_p = '\0';
  puVar9 = (uint *)(size + (long)raw);
  do {
    lVar7 = 7;
    if (puVar9 <= raw) goto LAB_002340b5;
    uVar12 = (ulong)(char)(byte)*raw;
    puVar17 = (uint *)((long)raw + 1);
    if ((long)uVar12 < 0) {
      bVar1 = (byte)*raw;
      uVar5 = (ulong)(bVar1 & 0x7f);
      bVar10 = false;
      puVar8 = puVar17;
      for (lVar6 = lVar7;
          (puVar11 = puVar8, uVar12 = uVar5, (char)bVar1 < '\0' &&
          (bVar20 = 0x38 < lVar6 - 7U, bVar10 = bVar20 || puVar9 <= puVar8, puVar11 = puVar17,
          uVar12 = 0, !bVar20 && puVar9 > puVar8)); lVar6 = lVar6 + 7) {
        bVar1 = (byte)*puVar8;
        in_R11 = (uint *)((ulong)(bVar1 & 0x7f) << ((byte)lVar6 & 0x3f));
        puVar8 = (uint *)((long)puVar8 + 1);
        uVar5 = uVar5 | (ulong)in_R11;
      }
      puVar17 = puVar11;
      if (bVar10) {
        puVar17 = (uint *)raw;
        uVar12 = 0;
      }
      if (puVar17 == (uint *)raw) goto LAB_002340b5;
    }
    uVar4 = (uint)(uVar12 >> 3);
    if ((uVar4 == 0) || (puVar9 <= puVar17)) {
switchD_00233f2f_caseD_3:
      bVar10 = false;
      uVar12 = 0;
      local_60.int_value_ = (uint64_t)(uint *)0x0;
    }
    else {
      switch((uint)uVar12 & 7) {
      case 0:
        puVar13 = (uint *)0x0;
        bVar10 = puVar17 >= puVar9;
        if (puVar17 < puVar9) {
          in_R11 = (uint *)((long)puVar17 + 1);
          puVar8 = (uint *)(ulong)((byte)*puVar17 & 0x7f);
          puVar11 = puVar8;
          uVar16 = 0;
          if ((char)(byte)*puVar17 < '\0') {
            puVar11 = (uint *)0x0;
            uVar16 = 0;
            lVar7 = 7;
            puVar18 = in_R11;
            do {
              bVar20 = 0x38 < lVar7 - 7U;
              bVar10 = bVar20 || puVar9 <= puVar18;
              if (bVar20 || puVar9 <= puVar18) goto LAB_002340bb;
              uVar2 = *puVar18;
              puVar18 = (uint *)((long)puVar18 + 1);
              puVar8 = (uint *)((ulong)puVar8 | (ulong)((byte)uVar2 & 0x7f) << ((byte)lVar7 & 0x3f))
              ;
              lVar7 = lVar7 + 7;
            } while ((char)(byte)uVar2 < '\0');
            puVar11 = (uint *)((ulong)puVar8 & 0xffffffff);
            in_R11 = puVar18;
            uVar16 = (uint)((ulong)puVar8 >> 0x20);
          }
        }
        else {
          puVar11 = (uint *)0x0;
          uVar16 = 0;
        }
LAB_002340bb:
        puVar8 = (uint *)(ulong)uVar16;
        if (bVar10) {
          in_R11 = puVar17;
          puVar8 = puVar13;
          puVar11 = puVar13;
        }
        local_50 = puVar17;
        local_40 = (uint *)raw;
        if (in_R11 != puVar17) goto LAB_002340e3;
        uVar12 = 0;
        bVar10 = false;
        local_60.int_value_ = (uint64_t)puVar13;
        goto LAB_00234125;
      case 1:
        in_R11 = puVar17 + 2;
        if (puVar9 < in_R11) {
LAB_002340b5:
          uVar12 = 0;
          bVar10 = false;
          local_60.int_value_ = (uint64_t)(uint *)0x0;
          goto LAB_00234125;
        }
        puVar11 = *(uint **)puVar17;
        puVar8 = (uint *)((ulong)puVar11 >> 0x20);
        break;
      case 2:
        bVar10 = puVar17 >= puVar9;
        pTVar19 = local_48;
        if (puVar17 < puVar9) {
          bVar1 = (byte)*puVar17;
          puVar11 = (uint *)(ulong)(bVar1 & 0x7f);
          puVar8 = (uint *)((long)puVar17 + 1U);
          for (; (in_R11 = puVar8, pTVar19 = (TraceStats_BufferStats *)puVar11, (char)bVar1 < '\0'
                 && (bVar20 = 0x38 < lVar7 - 7U, bVar10 = bVar20 || puVar9 <= puVar8,
                    in_R11 = (uint *)((long)puVar17 + 1U), pTVar19 = local_48,
                    !bVar20 && puVar9 > puVar8)); lVar7 = lVar7 + 7) {
            bVar1 = (byte)*puVar8;
            puVar8 = (uint *)((long)puVar8 + 1);
            puVar11 = (uint *)((ulong)puVar11 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f));
          }
        }
        local_48 = pTVar19;
        if (bVar10) {
          in_R11 = puVar17;
          local_48 = (TraceStats_BufferStats *)(uint *)0x0;
        }
        if ((in_R11 == puVar17) || ((uint *)((long)puVar9 - (long)in_R11) < local_48)) {
          puVar8 = (uint *)0x0;
          puVar11 = (uint *)0x0;
          bVar10 = false;
          puVar13 = (uint *)0x0;
        }
        else {
          puVar8 = (uint *)((ulong)in_R11 >> 0x20);
          puVar11 = (uint *)((ulong)in_R11 & 0xffffffff);
          in_R11 = (uint *)((long)in_R11 + (long)local_48);
          bVar10 = true;
          puVar13 = (uint *)local_48;
        }
        local_50 = puVar17;
        if (!bVar10) goto LAB_002340b5;
        goto LAB_002340e3;
      default:
        goto switchD_00233f2f_caseD_3;
      case 5:
        in_R11 = puVar17 + 1;
        puVar8 = (uint *)0x0;
        if (puVar9 < in_R11) goto LAB_002340b5;
        puVar11 = (uint *)(ulong)*puVar17;
      }
      puVar13 = (uint *)0x0;
LAB_002340e3:
      bVar10 = true;
      raw = in_R11;
      if ((uVar4 < 0x10000) && (puVar13 < (uint *)0x10000000)) {
        local_60.int_value_ = (ulong)puVar11 & 0xffffffff | (long)puVar8 << 0x20;
        uVar12 = (ulong)puVar13 | (uVar12 >> 3) << 0x20 | (ulong)((uint)uVar12 & 7) << 0x30;
        bVar10 = false;
      }
      else {
        local_60.int_value_ = 0;
        uVar12 = 0;
      }
    }
LAB_00234125:
    puVar8 = (uint *)0x7;
    puVar17 = &switchD_00233f2f::switchdataD_0034d504;
    if (!bVar10) {
      local_60.size_ = (uint32_t)uVar12;
      local_60.type_ = (uint8_t)(uVar12 >> 0x30);
      local_60.id_ = (uint16_t)(uVar12 >> 0x20);
      local_48 = this;
      do {
        if (local_60.id_ == 0) {
          return puVar9 == (uint *)raw;
        }
        if ((ushort)(uVar12 >> 0x20) < 0x14) {
          (this->_has_field_).super__Base_bitset<1UL>._M_w =
               (this->_has_field_).super__Base_bitset<1UL>._M_w |
               1L << ((byte)(uVar12 >> 0x20) & 0x3f);
        }
        uVar4 = ((uint)(uVar12 >> 0x20) & 0xffff) - 1;
        if (uVar4 < 0x13) {
          uVar3 = (*(code *)(&DAT_0034d51c + *(int *)(&DAT_0034d51c + (ulong)uVar4 * 4)))();
          return (bool)uVar3;
        }
        protozero::Field::SerializeAndAppendToInternal<std::__cxx11::string>(&local_60,local_38);
        do {
          if (puVar9 <= raw) goto LAB_00234619;
          uVar12 = (ulong)(char)(byte)*raw;
          puVar11 = (uint *)((long)raw + 1);
          if ((long)uVar12 < 0) {
            uVar5 = (ulong)((byte)*raw & 0x7f);
            bVar10 = false;
            uVar12 = uVar5;
            puVar13 = puVar11;
            if ((char)(byte)*raw < '\0') {
              lVar7 = 7;
              puVar18 = puVar11;
              do {
                bVar10 = 0x38 < lVar7 - 7U || puVar9 <= puVar18;
                uVar12 = 0;
                puVar13 = puVar11;
                if (bVar10) break;
                uVar4 = *puVar18;
                puVar13 = (uint *)((long)puVar18 + 1);
                uVar5 = uVar5 | (ulong)((byte)uVar4 & 0x7f) << ((byte)lVar7 & 0x3f);
                lVar7 = lVar7 + 7;
                uVar12 = uVar5;
                puVar18 = puVar13;
              } while ((char)(byte)uVar4 < '\0');
            }
            puVar11 = puVar13;
            if (bVar10) {
              puVar11 = (uint *)raw;
              uVar12 = 0;
            }
            if (puVar11 == (uint *)raw) goto LAB_00234619;
          }
          uVar4 = (uint)(uVar12 >> 3);
          if ((uVar4 == 0) || (puVar9 <= puVar11)) {
switchD_00234484_caseD_3:
            bVar10 = false;
            uVar12 = 0;
            local_60.int_value_ = (uint64_t)(uint *)0x0;
          }
          else {
            switch((uint)uVar12 & 7) {
            case 0:
              puVar15 = (uint *)0x0;
              bVar10 = puVar11 >= puVar9;
              if (puVar11 < puVar9) {
                puVar13 = (uint *)((long)puVar11 + 1);
                uVar16 = (byte)*puVar11 & 0x7f;
                uVar5 = (ulong)uVar16;
                puVar18 = (uint *)(ulong)uVar16;
                puVar17 = puVar13;
                uVar16 = 0;
                if ((char)(byte)*puVar11 < '\0') {
                  puVar18 = (uint *)0x0;
                  lVar7 = 7;
                  puVar14 = puVar13;
                  do {
                    bVar20 = 0x38 < lVar7 - 7U;
                    bVar10 = bVar20 || puVar9 <= puVar14;
                    puVar17 = puVar13;
                    uVar16 = 0;
                    if (bVar20 || puVar9 <= puVar14) break;
                    bVar1 = (byte)*puVar14;
                    puVar14 = (uint *)((long)puVar14 + 1);
                    uVar5 = uVar5 | (ulong)(bVar1 & 0x7f) << ((byte)lVar7 & 0x3f);
                    lVar7 = lVar7 + 7;
                    if (-1 < (char)bVar1) {
                      puVar18 = (uint *)(uVar5 & 0xffffffff);
                    }
                    puVar17 = puVar14;
                    uVar16 = (uint)(uVar5 >> 0x20);
                  } while (-1 >= (char)bVar1);
                }
              }
              else {
                puVar18 = (uint *)0x0;
                uVar16 = 0;
              }
              if (bVar10) {
                puVar18 = puVar15;
              }
              puVar13 = (uint *)(ulong)uVar16;
              if (bVar10) {
                puVar17 = puVar11;
                puVar13 = puVar15;
              }
              this = local_48;
              local_50 = puVar8;
              local_40 = (uint *)raw;
              if (puVar17 != puVar11) goto LAB_0023464d;
              uVar12 = 0;
              bVar10 = false;
              local_60.int_value_ = (uint64_t)puVar15;
              goto LAB_00234698;
            case 1:
              puVar17 = puVar11 + 2;
              if (puVar9 < puVar17) {
LAB_00234619:
                uVar12 = 0;
                bVar10 = false;
                local_60.int_value_ = (uint64_t)(uint *)0x0;
                goto LAB_00234698;
              }
              puVar18 = *(uint **)puVar11;
              puVar13 = (uint *)((ulong)puVar18 >> 0x20);
              break;
            case 2:
              bVar10 = puVar11 >= puVar9;
              puVar13 = puVar8;
              if (puVar11 < puVar9) {
                puVar18 = (uint *)((long)puVar11 + 1);
                puVar15 = (uint *)(ulong)((byte)*puVar11 & 0x7f);
                puVar17 = puVar18;
                puVar13 = puVar15;
                if ((char)(byte)*puVar11 < '\0') {
                  lVar7 = 7;
                  puVar14 = puVar18;
                  do {
                    bVar10 = 0x38 < lVar7 - 7U || puVar9 <= puVar14;
                    puVar17 = puVar18;
                    puVar13 = puVar8;
                    if (bVar10) break;
                    uVar16 = *puVar14;
                    puVar14 = (uint *)((long)puVar14 + 1);
                    puVar15 = (uint *)((ulong)puVar15 |
                                      (ulong)((byte)uVar16 & 0x7f) << ((byte)lVar7 & 0x3f));
                    lVar7 = lVar7 + 7;
                    puVar17 = puVar14;
                    puVar13 = puVar15;
                  } while ((char)(byte)uVar16 < '\0');
                }
              }
              puVar18 = (uint *)0x0;
              puVar8 = puVar13;
              if (bVar10) {
                puVar17 = puVar11;
                puVar8 = puVar18;
              }
              if (puVar17 == puVar11) {
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar15 = (uint *)0x0;
              }
              else if ((uint *)((long)puVar9 - (long)puVar17) < puVar8) {
                puVar18 = (uint *)0x0;
                puVar13 = (uint *)0x0;
                bVar10 = false;
                puVar15 = (uint *)0x0;
              }
              else {
                puVar13 = (uint *)((ulong)puVar17 >> 0x20);
                puVar18 = (uint *)((ulong)puVar17 & 0xffffffff);
                puVar17 = (uint *)((long)puVar17 + (long)puVar8);
                bVar10 = true;
                puVar15 = puVar8;
              }
              if (!bVar10) goto LAB_00234619;
              goto LAB_0023464d;
            default:
              goto switchD_00234484_caseD_3;
            case 5:
              puVar17 = puVar11 + 1;
              puVar13 = (uint *)0x0;
              if (puVar9 < puVar17) goto LAB_00234619;
              puVar18 = (uint *)(ulong)*puVar11;
            }
            puVar15 = (uint *)0x0;
LAB_0023464d:
            bVar10 = true;
            raw = puVar17;
            if ((uVar4 < 0x10000) && (puVar15 < (uint *)0x10000000)) {
              local_60.int_value_ = (ulong)puVar18 & 0xffffffff | (long)puVar13 << 0x20;
              uVar12 = (ulong)puVar15 | (uVar12 >> 3) << 0x20 | (uVar12 & 7) << 0x30;
              bVar10 = false;
            }
            else {
              local_60.int_value_ = 0;
              uVar12 = 0;
            }
          }
LAB_00234698:
        } while (bVar10);
        local_60.size_ = (uint32_t)uVar12;
        local_60.type_ = (uint8_t)(uVar12 >> 0x30);
        local_60.id_ = (uint16_t)(uVar12 >> 0x20);
      } while( true );
    }
  } while( true );
}

Assistant:

bool TraceStats_BufferStats::ParseFromArray(const void* raw, size_t size) {
  unknown_fields_.clear();
  bool packed_error = false;

  ::protozero::ProtoDecoder dec(raw, size);
  for (auto field = dec.ReadField(); field.valid(); field = dec.ReadField()) {
    if (field.id() < _has_field_.size()) {
      _has_field_.set(field.id());
    }
    switch (field.id()) {
      case 12 /* buffer_size */:
        field.get(&buffer_size_);
        break;
      case 1 /* bytes_written */:
        field.get(&bytes_written_);
        break;
      case 13 /* bytes_overwritten */:
        field.get(&bytes_overwritten_);
        break;
      case 14 /* bytes_read */:
        field.get(&bytes_read_);
        break;
      case 15 /* padding_bytes_written */:
        field.get(&padding_bytes_written_);
        break;
      case 16 /* padding_bytes_cleared */:
        field.get(&padding_bytes_cleared_);
        break;
      case 2 /* chunks_written */:
        field.get(&chunks_written_);
        break;
      case 10 /* chunks_rewritten */:
        field.get(&chunks_rewritten_);
        break;
      case 3 /* chunks_overwritten */:
        field.get(&chunks_overwritten_);
        break;
      case 18 /* chunks_discarded */:
        field.get(&chunks_discarded_);
        break;
      case 17 /* chunks_read */:
        field.get(&chunks_read_);
        break;
      case 11 /* chunks_committed_out_of_order */:
        field.get(&chunks_committed_out_of_order_);
        break;
      case 4 /* write_wrap_count */:
        field.get(&write_wrap_count_);
        break;
      case 5 /* patches_succeeded */:
        field.get(&patches_succeeded_);
        break;
      case 6 /* patches_failed */:
        field.get(&patches_failed_);
        break;
      case 7 /* readaheads_succeeded */:
        field.get(&readaheads_succeeded_);
        break;
      case 8 /* readaheads_failed */:
        field.get(&readaheads_failed_);
        break;
      case 9 /* abi_violations */:
        field.get(&abi_violations_);
        break;
      case 19 /* trace_writer_packet_loss */:
        field.get(&trace_writer_packet_loss_);
        break;
      default:
        field.SerializeAndAppendTo(&unknown_fields_);
        break;
    }
  }
  return !packed_error && !dec.bytes_left();
}